

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double Alg::productLog(double realz,double imagez)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __y;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (1e-10 <= ABS(imagez) + ABS(realz)) {
    __x = log(realz);
    dVar1 = log(__x * __x + 0.0);
    dVar1 = (dVar1 * 0.5 + __x) - __x;
    dVar2 = atan2(0.0,__x);
    __y = 0.0;
    dVar2 = dVar2 + 0.0;
    dVar3 = ABS(dVar2) + ABS(dVar1);
    realz = __x;
    do {
      if (dVar3 <= 1e-10) {
        return realz;
      }
      dVar5 = realz * realz + __y * __y;
      dVar13 = realz / dVar5 + 1.0;
      dVar5 = __y / dVar5;
      dVar8 = dVar13 * dVar13 + dVar5 * dVar5;
      dVar6 = dVar5 * dVar2;
      dVar5 = dVar5 * dVar1;
      dVar12 = dVar1 * dVar13;
      dVar13 = dVar13 * dVar2;
      dVar7 = dVar3;
      dVar9 = __y;
      dVar10 = realz;
      dVar11 = 1.0;
      do {
        realz = dVar10 - dVar11 * ((dVar12 - dVar6) / dVar8);
        __y = dVar9 - dVar11 * ((dVar13 - dVar5) / dVar8);
        dVar1 = log(realz * realz + __y * __y);
        dVar1 = (dVar1 * 0.5 + realz) - __x;
        dVar2 = atan2(__y,realz);
        dVar2 = dVar2 + __y;
        dVar4 = -1.03;
        dVar3 = ABS(dVar2) + ABS(dVar1);
        if (dVar7 <= ABS(dVar2) + ABS(dVar1)) {
          dVar4 = dVar11 + -0.1;
          dVar3 = dVar7;
          __y = dVar9;
          realz = dVar10;
        }
        dVar7 = dVar3;
        dVar9 = __y;
        dVar10 = realz;
        dVar11 = dVar4;
      } while (-1.0 <= dVar4);
    } while (-1.05 < dVar4);
  }
  return realz;
}

Assistant:

double Alg::productLog(double realz, double imagez) {
    if (fabs(realz) + fabs(imagez) < 1e-10) {
        return realz;
    }
    double lnx = log(realz);
    double zx = lnx;
    double zy = 0;
    double F[2];
    double Fx[2];
    double Fy[2];
    double temp = 0;
    double x = zx;
    double y = zy;
    double x0 = 0;
    double y0 = 0;
    Fy[0] = log(x * x + y * y) / 2 + x - zx;
    Fy[1] = y - zy + atan2(y, x);
    double error = fabs(Fy[0]) + fabs(Fy[1]);
    int loopn = 1000;
    double w = 1;
    while (loopn > 0 && w > -1.05 && error > 1e-10) {
        w = x * x + y * y;
        F[0] = x / w + 1;
        F[1] = y / w;
        w = F[0] * F[0] + F[1] * F[1];
        Fx[0] = (Fy[0] * F[0] - Fy[1] * F[1]) / w;
        Fx[1] = (Fy[1] * F[0] - Fy[0] * F[1]) / w;
        w = 1;
        while (w >= -1){
            x0 = x - w * Fx[0];
            y0 = y - w * Fx[1];
            Fy[0] = log(x0 * x0 + y0 * y0) / 2 + x0 - zx;
            Fy[1] = y0 - zy + atan2(y0, x0);
            temp = fabs(Fy[0]) + fabs(Fy[1]);
            if (temp < error) {
                error = temp;
                x = x0;
                y = y0;
                w = -1.03;
            }
            else {
                w = w - 0.1;
            }
        }
    }
    return x;
}